

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

char * parse_headers(char *buf,char *buf_end,phr_header *headers,size_t *num_headers,
                    size_t max_headers,int *ret)

{
  char *pcStack_58;
  char c;
  char *value_end;
  size_t value_len;
  char *value;
  int *ret_local;
  size_t max_headers_local;
  size_t *num_headers_local;
  phr_header *headers_local;
  char *buf_end_local;
  char *buf_local;
  
  value = (char *)ret;
  ret_local = (int *)max_headers;
  max_headers_local = (size_t)num_headers;
  num_headers_local = (size_t *)headers;
  headers_local = (phr_header *)buf_end;
  buf_end_local = buf;
  while( true ) {
    if ((phr_header *)buf_end_local == headers_local) {
      value[0] = -2;
      value[1] = -1;
      value[2] = -1;
      value[3] = -1;
      return (char *)0x0;
    }
    if (*buf_end_local == '\r') {
      if ((phr_header *)(buf_end_local + 1) == headers_local) {
        value[0] = -2;
        value[1] = -1;
        value[2] = -1;
        value[3] = -1;
        return (char *)0x0;
      }
      if (*(char *)&((phr_header *)(buf_end_local + 1))->name == '\n') {
        return buf_end_local + 2;
      }
      value[0] = -1;
      value[1] = -1;
      value[2] = -1;
      value[3] = -1;
      return (char *)0x0;
    }
    if (*buf_end_local == '\n') {
      return buf_end_local + 1;
    }
    if (*(int **)max_headers_local == ret_local) break;
    if ((*(long *)max_headers_local == 0) || ((*buf_end_local != ' ' && (*buf_end_local != '\t'))))
    {
      buf_end_local =
           parse_token(buf_end_local,(char *)headers_local,
                       (char **)(num_headers_local + *(long *)max_headers_local * 4),
                       num_headers_local + *(long *)max_headers_local * 4 + 1,':',(int *)value);
      if (buf_end_local == (char *)0x0) {
        return (char *)0x0;
      }
      if (num_headers_local[*(long *)max_headers_local * 4 + 1] == 0) {
        value[0] = -1;
        value[1] = -1;
        value[2] = -1;
        value[3] = -1;
        return (char *)0x0;
      }
      do {
        buf_end_local = buf_end_local + 1;
        if ((phr_header *)buf_end_local == headers_local) {
          value[0] = -2;
          value[1] = -1;
          value[2] = -1;
          value[3] = -1;
          return (char *)0x0;
        }
      } while ((*buf_end_local == ' ') || (*buf_end_local == '\t'));
    }
    else {
      num_headers_local[*(long *)max_headers_local * 4] = 0;
      num_headers_local[*(long *)max_headers_local * 4 + 1] = 0;
    }
    buf_end_local =
         get_token_to_eol(buf_end_local,(char *)headers_local,(char **)&value_len,
                          (size_t *)&value_end,(int *)value);
    if (buf_end_local == (char *)0x0) {
      return (char *)0x0;
    }
    for (pcStack_58 = value_end + value_len;
        (pcStack_58 != (char *)value_len && ((pcStack_58[-1] == ' ' || (pcStack_58[-1] == '\t'))));
        pcStack_58 = pcStack_58 + -1) {
    }
    num_headers_local[*(long *)max_headers_local * 4 + 2] = value_len;
    num_headers_local[*(long *)max_headers_local * 4 + 3] = (long)pcStack_58 - value_len;
    *(long *)max_headers_local = *(long *)max_headers_local + 1;
  }
  value[0] = -1;
  value[1] = -1;
  value[2] = -1;
  value[3] = -1;
  return (char *)0x0;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end, struct phr_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret)
{
    for (;; ++*num_headers) {
        CHECK_EOF();
        if (*buf == '\015') {
            ++buf;
            EXPECT_CHAR('\012');
            break;
        } else if (*buf == '\012') {
            ++buf;
            break;
        }
        if (*num_headers == max_headers) {
            *ret = -1;
            return NULL;
        }
        if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
            /* parsing name, but do not discard SP before colon, see
             * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
            if ((buf = parse_token(buf, buf_end, &headers[*num_headers].name, &headers[*num_headers].name_len, ':', ret)) == NULL) {
                return NULL;
            }
            if (headers[*num_headers].name_len == 0) {
                *ret = -1;
                return NULL;
            }
            ++buf;
            for (;; ++buf) {
                CHECK_EOF();
                if (!(*buf == ' ' || *buf == '\t')) {
                    break;
                }
            }
        } else {
            headers[*num_headers].name = NULL;
            headers[*num_headers].name_len = 0;
        }
        const char *value;
        size_t value_len;
        if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) == NULL) {
            return NULL;
        }
        /* remove trailing SPs and HTABs */
        const char *value_end = value + value_len;
        for (; value_end != value; --value_end) {
            const char c = *(value_end - 1);
            if (!(c == ' ' || c == '\t')) {
                break;
            }
        }
        headers[*num_headers].value = value;
        headers[*num_headers].value_len = value_end - value;
    }
    return buf;
}